

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall Dumper::dumpToTty(Dumper *this)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  iterator this_00;
  ContainedType *this_01;
  reference ppRVar4;
  iterator this_02;
  reference ppRVar5;
  ReadWriteGraph *in_RDI;
  RWNode *def;
  iterator __end5;
  iterator __begin5;
  vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *__range5;
  RWNode *node;
  iterator __end3;
  iterator __begin3;
  NodesT *__range3;
  ContainedType *bb;
  block_iterator __end2;
  block_iterator __begin2;
  blocks_range *__range2;
  ContainedType *subg;
  subgraph_iterator __end1;
  subgraph_iterator __begin1;
  subgraphs_range *__range1;
  Dumper *in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff58;
  undefined1 local_98 [24];
  undefined1 *local_80;
  RWNode *local_78;
  _Self local_70;
  _Self local_68;
  NodesT *local_60;
  iterator local_48;
  BBlocksVecT *local_40;
  BBlocksVecT **local_38;
  ContainedType *local_30;
  iterator local_28;
  iterator local_20;
  SubgraphsT *local_18;
  SubgraphsT **local_10;
  
  dg::dda::LLVMDataDependenceAnalysis::getGraph((LLVMDataDependenceAnalysis *)0x17a6b4);
  local_18 = (SubgraphsT *)dg::dda::ReadWriteGraph::subgraphs(in_RDI);
  local_10 = &local_18;
  local_20._M_current =
       (unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_> *)
       dg::dda::ReadWriteGraph::subgraphs_range::begin((subgraphs_range *)in_RDI);
  local_28._M_current =
       (unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_> *)
       dg::dda::ReadWriteGraph::subgraphs_range::end((subgraphs_range *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_*,_std::vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>_>
                             *)in_stack_ffffffffffffff50,
                            (__normal_iterator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_*,_std::vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>_>
                             *)in_RDI), bVar1) {
    local_30 = dg::dda::ReadWriteGraph::subgraph_iterator::operator*((subgraph_iterator *)0x17a729);
    dg::dda::RWSubgraph::getName_abi_cxx11_(local_30);
    uVar3 = std::__cxx11::string::c_str();
    printf("=========== fun: %s ===========\n",uVar3);
    local_40 = (BBlocksVecT *)dg::dda::RWSubgraph::bblocks((RWSubgraph *)in_RDI);
    local_38 = &local_40;
    local_48._M_current =
         (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
         dg::dda::RWSubgraph::blocks_range::begin((blocks_range *)in_RDI);
    this_00._M_current =
         (unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_> *)
         dg::dda::RWSubgraph::blocks_range::end((blocks_range *)in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                               *)in_stack_ffffffffffffff50,
                              (__normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
                               *)in_RDI), bVar1) {
      this_01 = dg::dda::RWSubgraph::block_iterator::operator*((block_iterator *)0x17a7bc);
      uVar2 = dg::ElemId::getID((ElemId *)this_01);
      printf("<<< bblock: %u >>>\n",(ulong)uVar2);
      local_60 = dg::BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode>::getNodes_abi_cxx11_
                           ((BBlockBase<dg::dda::RWBBlock,dg::dda::RWNode> *)this_01);
      local_68._M_node =
           (_List_node_base *)
           std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                     ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI);
      local_70._M_node =
           (_List_node_base *)
           std::__cxx11::list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                     ((list<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI);
      while (bVar1 = std::operator!=(&local_68,&local_70), bVar1) {
        ppRVar4 = std::_List_iterator<dg::dda::RWNode_*>::operator*
                            ((_List_iterator<dg::dda::RWNode_*> *)0x17a82a);
        local_78 = *ppRVar4;
        dumpRWNode(in_stack_ffffffffffffff50,(RWNode *)in_RDI);
        bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                          ((opt_storage<bool,_false,_false> *)0x17a853);
        if (((!bVar1) && (bVar1 = dg::dda::RWNode::isUse((RWNode *)0x17a865), bVar1)) &&
           (bVar1 = dg::dda::RWNode::isPhi((RWNode *)in_stack_ffffffffffffff50), !bVar1)) {
          dg::dda::LLVMDataDependenceAnalysis::getDefinitions
                    ((LLVMDataDependenceAnalysis *)in_stack_ffffffffffffff58._M_current,
                     (RWNode *)in_stack_ffffffffffffff50);
          local_80 = local_98;
          this_02 = std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::begin
                              ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                               in_RDI);
          in_stack_ffffffffffffff58 =
               std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::end
                         ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)in_RDI);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                     *)in_stack_ffffffffffffff50,
                                    (__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                     *)in_RDI), bVar1) {
            ppRVar5 = __gnu_cxx::
                      __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                      ::operator*((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                                   *)&stack0xffffffffffffff60);
            in_stack_ffffffffffffff50 = (Dumper *)*ppRVar5;
            printf("  <- ");
            printName((Dumper *)this_00._M_current,(RWNode *)this_01);
            putchar(10);
            __gnu_cxx::
            __normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
            ::operator++((__normal_iterator<dg::dda::RWNode_**,_std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>_>
                          *)&stack0xffffffffffffff60);
          }
          std::vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>::~vector
                    ((vector<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_> *)
                     this_02._M_current);
        }
        std::_List_iterator<dg::dda::RWNode_*>::operator++(&local_68);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_*,_std::vector<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>,_std::allocator<std::unique_ptr<dg::dda::RWBBlock,_std::default_delete<dg::dda::RWBBlock>_>_>_>_>
      ::operator++(&local_48);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_*,_std::vector<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>,_std::allocator<std::unique_ptr<dg::dda::RWSubgraph,_std::default_delete<dg::dda::RWSubgraph>_>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void dumpToTty() {
        for (auto *subg : DDA->getGraph()->subgraphs()) {
            printf("=========== fun: %s ===========\n",
                   subg->getName().c_str());
            for (auto *bb : subg->bblocks()) {
                printf("<<< bblock: %u >>>\n", bb->getID());
                for (auto *node : bb->getNodes()) {
                    dumpRWNode(node);
                    if (!graph_only && node->isUse() && !node->isPhi()) {
                        for (RWNode *def : DDA->getDefinitions(node)) {
                            printf("  <- ");
                            printName(def);
                            putchar('\n');
                        }
                    }
                }
            }
        }
    }